

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::reciprocal
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this)

{
  MatrixXd *pMVar1;
  VectorXd c;
  vectype local_78;
  undefined1 local_68 [16];
  MatrixXd *local_58;
  double *local_48;
  double *local_38;
  ChebyshevExpansion *local_30;
  
  pMVar1 = LMatrixLibrary::get((LMatrixLibrary *)l_matrix_library,
                               (this->m_c).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows - 1);
  get_node_function_values((ChebyshevExpansion *)local_68);
  if ((long)local_68._8_8_ < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
                 );
  }
  local_48 = (double *)local_68._8_8_;
  local_38 = (double *)0x3ff0000000000000;
  local_58 = pMVar1;
  local_30 = (ChebyshevExpansion *)local_68;
  if ((double *)
      (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
      (double *)local_68._8_8_) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_78,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_0>_>
                *)&local_58);
    free((void *)local_68._0_8_);
    ChebyshevExpansion(__return_storage_ptr__,&local_78,this->m_xmin,this->m_xmax);
    free(local_78.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Product.h"
                ,0x62,
                "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>>, Option = 0]"
               );
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::reciprocal() const{
        // 1. Transform Chebyshev-Lobatto node function values by the function f(y) -> 1/y
        // 2. Go backwards to coefficients from node values c2 = V/y
        const auto Ndegree = m_c.size() - 1;
        const Eigen::MatrixXd& V = l_matrix_library.get(Ndegree);
        // Values at the nodes in the x range of [-1, 1]
        Eigen::VectorXd c = V*(1.0/get_node_function_values().array()).matrix();
        
        return ChebyshevExpansion(c, xmin(), xmax());
    }